

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int tableAndColumnIndex(SrcList *pSrc,int iStart,int iEnd,char *zCol,int *piTab,int *piCol,
                       int bIgnoreHidden)

{
  int iCol_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Table *in_R8;
  int *in_R9;
  int iCol;
  int i;
  int local_34;
  
  local_34 = in_ESI;
  while( true ) {
    if (in_EDX < local_34) {
      return 0;
    }
    iCol_00 = sqlite3ColumnIndex(in_R8,(char *)in_R9);
    if ((-1 < iCol_00) &&
       (((int)piCol == 0 ||
        ((*(ushort *)
           (*(long *)(*(long *)(in_RDI + (long)local_34 * 0x48 + 0x18) + 8) + (long)iCol_00 * 0x10 +
           0xe) & 2) == 0)))) break;
    local_34 = local_34 + 1;
  }
  if (in_R8 != (Table *)0x0) {
    sqlite3SrcItemColumnUsed((SrcItem *)(in_RDI + 8 + (long)local_34 * 0x48),iCol_00);
    *(int *)&in_R8->zName = local_34;
    *in_R9 = iCol_00;
  }
  return 1;
}

Assistant:

static int tableAndColumnIndex(
  SrcList *pSrc,       /* Array of tables to search */
  int iStart,          /* First member of pSrc->a[] to check */
  int iEnd,            /* Last member of pSrc->a[] to check */
  const char *zCol,    /* Name of the column we are looking for */
  int *piTab,          /* Write index of pSrc->a[] here */
  int *piCol,          /* Write index of pSrc->a[*piTab].pTab->aCol[] here */
  int bIgnoreHidden    /* Ignore hidden columns */
){
  int i;               /* For looping over tables in pSrc */
  int iCol;            /* Index of column matching zCol */

  assert( iEnd<pSrc->nSrc );
  assert( iStart>=0 );
  assert( (piTab==0)==(piCol==0) );  /* Both or neither are NULL */

  for(i=iStart; i<=iEnd; i++){
    iCol = sqlite3ColumnIndex(pSrc->a[i].pSTab, zCol);
    if( iCol>=0
     && (bIgnoreHidden==0 || IsHiddenColumn(&pSrc->a[i].pSTab->aCol[iCol])==0)
    ){
      if( piTab ){
        sqlite3SrcItemColumnUsed(&pSrc->a[i], iCol);
        *piTab = i;
        *piCol = iCol;
      }
      return 1;
    }
  }
  return 0;
}